

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

shared_ptr<void> * __thiscall pstore::storage::segment_base(storage *this,segment_type segment)

{
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var1;
  ulong uVar2;
  long lVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  
  _Var1._M_head_impl =
       (this->sat_)._M_t.
       super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  uVar4 = (ulong)(uint)((int)CONCAT62(in_register_00000032,segment) << 5);
  uVar2 = *(ulong *)((long)(_Var1._M_head_impl)->_M_elems + uVar4);
  lVar3 = *(long *)((long)(_Var1._M_head_impl)->_M_elems + uVar4 + 0x10);
  if ((uVar2 != 0 || lVar3 != 0) &&
     ((uVar2 < *(ulong *)(lVar3 + 8) ||
      (*(ulong *)(lVar3 + 8) + *(long *)(lVar3 + 0x28) < uVar2 + 0x400000)))) {
    assert_failed("e.is_valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x109);
  }
  return (shared_ptr<void> *)((long)(_Var1._M_head_impl)->_M_elems + uVar4);
}

Assistant:

std::shared_ptr<void> const & segment_base (address::segment_type const segment) noexcept {
            return segment_base_impl (*this, segment);
        }